

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O2

ostream * Hpipe::cc(ostream *os,int r)

{
  ostream *poVar1;
  char *pcVar2;
  
  if (r == 0x5c) {
    pcVar2 = "\'\\\\\'";
  }
  else {
    if (r == 0x27 || 0x5e < r - 0x20U) {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,r);
      return poVar1;
    }
    poVar1 = std::operator<<(os,"\'");
    os = std::operator<<(poVar1,(char)r);
    pcVar2 = "\'";
  }
  poVar1 = std::operator<<(os,pcVar2);
  return poVar1;
}

Assistant:

static std::ostream &cc( std::ostream &os, int r ) {
    if ( r == '\\' )
        return os << "'\\\\'";
    if ( r >= 0x20 and r <= 0x7e and r != 39 )
        return os << "'" << char( r ) << "'";
    return os << r;
}